

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

Attachment __thiscall QCss::Declaration::attachmentValue(Declaration *this)

{
  bool bVar1;
  DeclarationData *pDVar2;
  qsizetype qVar3;
  quint64 qVar4;
  QCssKnownValue *in_RDI;
  long in_FS_OFFSET;
  int v;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QCssKnownValue *start;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Attachment AVar5;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  start = in_RDI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3276a);
  bVar1 = ::QVariant::isValid((QVariant *)in_RDI);
  if (bVar1) {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32786
                       );
    AVar5 = ::QVariant::toInt((bool *)&pDVar2->parsed);
  }
  else {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa327a9
                       );
    qVar3 = QList<QCss::Value>::size(&pDVar2->values);
    if (qVar3 == 1) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa327d2);
      QList<QCss::Value>::at
                ((QList<QCss::Value> *)in_RDI,
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      ::QVariant::toString();
      qVar4 = findKnownValue((QString *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),start,
                             in_stack_ffffffffffffffac);
      AVar5 = (Attachment)qVar4;
      QString::~QString((QString *)0xa32817);
      ::QVariant::QVariant(&local_28,AVar5);
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32837);
      ::QVariant::operator=
                ((QVariant *)CONCAT44(AVar5,in_stack_ffffffffffffffa8),(QVariant *)in_RDI);
      ::QVariant::~QVariant(&local_28);
    }
    else {
      AVar5 = Attachment_Unknown;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return AVar5;
  }
  __stack_chk_fail();
}

Assistant:

Attachment Declaration::attachmentValue() const
{
    if (d->parsed.isValid())
        return static_cast<Attachment>(d->parsed.toInt());
    if (d->values.size() != 1)
        return Attachment_Unknown;
    int v = findKnownValue(d->values.at(0).variant.toString(),
                           attachments, NumKnownAttachments);
    d->parsed = v;
    return static_cast<Attachment>(v);
}